

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

optional<slang::ast::SequenceRange> __thiscall
slang::ast::AssertionExpr::visit<(anonymous_namespace)::SequenceLengthVisitor>
          (AssertionExpr *this,SequenceLengthVisitor *visitor)

{
  optional<slang::ast::SequenceRange> oVar1;
  
  oVar1.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRange> =
       (_Optional_base<slang::ast::SequenceRange,_true,_true>)
       (*(code *)(&DAT_00563140 + *(int *)(&DAT_00563140 + (ulong)this->kind * 4)))
                 (this,visitor,&DAT_00563140 + *(int *)(&DAT_00563140 + (ulong)this->kind * 4),0x18)
  ;
  return (optional<slang::ast::SequenceRange>)
         oVar1.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ast::SequenceRange>;
}

Assistant:

decltype(auto) AssertionExpr::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case AssertionExprKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        CASE(Invalid, InvalidAssertionExpr);
        CASE(Simple, SimpleAssertionExpr);
        CASE(SequenceConcat, SequenceConcatExpr);
        CASE(SequenceWithMatch, SequenceWithMatchExpr);
        CASE(Unary, UnaryAssertionExpr);
        CASE(Binary, BinaryAssertionExpr);
        CASE(FirstMatch, FirstMatchAssertionExpr);
        CASE(Clocking, ClockingAssertionExpr);
        CASE(StrongWeak, StrongWeakAssertionExpr);
        CASE(Abort, AbortAssertionExpr);
        CASE(Conditional, ConditionalAssertionExpr);
        CASE(Case, CaseAssertionExpr);
        CASE(DisableIff, DisableIffAssertionExpr);
    }
#undef CASE
    // clang-format on
    SLANG_UNREACHABLE;
}